

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t tdefl_compress_mem_to_mem
                 (void *pOut_buf,size_t out_buf_len,void *pSrc_buf,size_t src_buf_len,int flags)

{
  mz_bool mVar1;
  void *in_RCX;
  undefined8 in_RSI;
  void *in_RDI;
  undefined4 in_R8D;
  tdefl_output_buffer out_buf;
  size_t local_50;
  tdefl_put_buf_func_ptr in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  size_t local_8;
  
  memset(&local_50,0,0x20);
  if (in_RDI == (void *)0x0) {
    local_8 = 0;
  }
  else {
    mVar1 = tdefl_compress_mem_to_output
                      (in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                       in_RDI,(int)((ulong)in_RSI >> 0x20));
    if (mVar1 == 0) {
      local_8 = 0;
    }
    else {
      local_8 = local_50;
    }
  }
  return local_8;
}

Assistant:

size_t tdefl_compress_mem_to_mem(void *pOut_buf, size_t out_buf_len,
                                 const void *pSrc_buf, size_t src_buf_len,
                                 int flags) {
  tdefl_output_buffer out_buf;
  MZ_CLEAR_OBJ(out_buf);
  if (!pOut_buf) return 0;
  out_buf.m_pBuf = (mz_uint8 *)pOut_buf;
  out_buf.m_capacity = out_buf_len;
  if (!tdefl_compress_mem_to_output(
          pSrc_buf, src_buf_len, tdefl_output_buffer_putter, &out_buf, flags))
    return 0;
  return out_buf.m_size;
}